

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcControl::IfcControl(IfcControl *this)

{
  IfcControl *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcObject).field_0xe0,"IfcControl");
  IfcObject::IfcObject(&this->super_IfcObject,&PTR_construction_vtable_24__01058058);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcControl,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcControl,_0UL> *)
             &(this->super_IfcObject).field_0xd0,&PTR_construction_vtable_24__010580d0);
  *(undefined8 *)&this->super_IfcObject = 0x1057fa0;
  *(undefined8 *)&(this->super_IfcObject).field_0xe0 = 0x1058040;
  *(undefined8 *)&(this->super_IfcObject).field_0x88 = 0x1057fc8;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x1057ff0;
  *(undefined8 *)&(this->super_IfcObject).field_0xd0 = 0x1058018;
  return;
}

Assistant:

IfcControl() : Object("IfcControl") {}